

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execShiftIm<(moira::Core)1,(moira::Instr)94,(moira::Mode)11,4>(Moira *this,u16 opcode)

{
  int iVar1;
  u32 uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = 8;
  if ((opcode & 0xe00) != 0) {
    uVar5 = opcode >> 9 & 7;
  }
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = read<(moira::Core)1,(moira::AddrSpace)2,2,4ull>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  this->readBuffer = (u16)uVar2;
  iVar1 = *(int *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4);
  uVar4 = uVar5;
  do {
    iVar3 = iVar1;
    iVar1 = iVar3 * 2 - (iVar3 >> 0x1f);
    uVar4 = uVar4 - 1;
  } while (uVar4 != 0);
  (this->reg).sr.c = SUB41((uint)iVar3 >> 0x1f,0);
  (this->reg).sr.v = false;
  (this->reg).sr.n = SUB41((uint)(iVar3 * 2) >> 0x1f,0);
  (this->reg).sr.z = iVar1 == 0;
  *(int *)((long)&(this->reg).field_3 + (ulong)(opcode & 7) * 4) = iVar1;
  (*this->_vptr_Moira[2])(this,(ulong)(uVar5 * 2 + 8));
  return;
}

Assistant:

void
Moira::execShiftIm(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);
    int cnt = src ? src : 8;
    int cyc = (S == Long ? 4 : 2) + 2 * cnt;

    prefetch<C, POLL>();
    SYNC(cyc);

    writeD<S>(dst, shift<C, I, S>(cnt, readD<S>(dst)));

    if constexpr (C == Core::C68000 || C == Core::C68010) {

        CYCLES(4 + cyc);

    } else {

        switch (I) {

            case Instr::LSL:
            case Instr::LSR:
                
                CYCLES(4);
                break;
                
            case Instr::ROL:
            case Instr::ROR:
            case Instr::ASL:
                
                CYCLES(8);
                break;
                
            case Instr::ROXL:
            case Instr::ROXR:
                
                CYCLES(12);
                break;
                
            default:
                
                CYCLES(6);
                break;
        }
    }

    FINALIZE
}